

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

int isSelPropNewValueNotify(Display *display,XEvent *event,XPointer pointer)

{
  if (((event->type == 0x1c) && ((event->xexpose).count == 0)) &&
     ((event->xany).window == *(Window *)(pointer + 0x20))) {
    return (int)((event->xkey).root == *(Window *)(pointer + 0x38));
  }
  return 0;
}

Assistant:

static Bool isSelPropNewValueNotify(Display* display, XEvent* event, XPointer pointer)
{
    XEvent* notification = (XEvent*) pointer;
    return event->type == PropertyNotify &&
           event->xproperty.state == PropertyNewValue &&
           event->xproperty.window == notification->xselection.requestor &&
           event->xproperty.atom == notification->xselection.property;
}